

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

void __thiscall Glucose::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar8;
  vec<unsigned_int> *pvVar9;
  long lVar10;
  int iVar7;
  
  if (this->use_simplification == true) {
    if (0 < (this->super_Solver).vardata.sz) {
      lVar8 = 0;
      do {
        pvVar9 = (this->occurs).occs.data;
        if (0 < pvVar9[lVar8].sz) {
          pvVar9 = pvVar9 + lVar8;
          lVar5 = 0;
          lVar10 = 0;
          do {
            ClauseAllocator::reloc(&(this->super_Solver).ca,(CRef *)((long)pvVar9->data + lVar5),to)
            ;
            lVar10 = lVar10 + 1;
            lVar5 = lVar5 + 4;
          } while (lVar10 < pvVar9->sz);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < (this->super_Solver).vardata.sz);
    }
    iVar6 = (this->subsumption_queue).end;
    iVar2 = (this->subsumption_queue).buf.sz;
    iVar1 = (this->subsumption_queue).first;
    iVar4 = 0;
    iVar3 = iVar6 - iVar1;
    iVar7 = 0;
    if (iVar6 < iVar1) {
      iVar7 = iVar2;
    }
    iVar6 = iVar7 + iVar3;
    if (iVar6 != 0 && SCARRY4(iVar7,iVar3) == iVar6 < 0) {
      do {
        ClauseAllocator::reloc
                  (&(this->super_Solver).ca,
                   (this->subsumption_queue).buf.data + (iVar1 + iVar4) % iVar2,to);
        iVar4 = iVar4 + 1;
        iVar6 = (this->subsumption_queue).end;
        iVar2 = (this->subsumption_queue).buf.sz;
        iVar1 = (this->subsumption_queue).first;
        iVar7 = 0;
        if (iVar6 < iVar1) {
          iVar7 = iVar2;
        }
      } while (iVar4 < (iVar6 - iVar1) + iVar7);
    }
    ClauseAllocator::reloc(&(this->super_Solver).ca,&this->bwdsub_tmpunit,to);
    return;
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (int i = 0; i < nVars(); i++){
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (int i = 0; i < subsumption_queue.size(); i++)
        ca.reloc(subsumption_queue[i], to);

    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}